

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

size_t Base64ToByteStream(char *InBuffer,size_t InCount,uint8_t *OutBuffer,size_t len)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  
  if (isFirstTime == '\0') {
    isFirstTime = '\x01';
    memset(iT64,0xff,0x100);
    lVar4 = 0;
    do {
      iT64["ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"[lVar4]] = (char)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40);
    iT64[0x3d] = '\0';
  }
  if ((InCount & 3) == 0 && InCount != 0) {
    pcVar5 = InBuffer + InCount;
    uVar7 = ((long)(((InCount >> 2) << 0x20) * 3) >> 0x20) + 1;
    do {
      pcVar5 = pcVar5 + -1;
      uVar7 = uVar7 - 1;
    } while (*pcVar5 == '=');
    sVar6 = 0xffffffffffffffff;
    if ((uVar7 <= len) && (iVar8 = (int)(InCount >> 2), sVar6 = uVar7, 0 < iVar8)) {
      pbVar1 = OutBuffer + uVar7;
      lVar4 = 0;
      do {
        bVar2 = iT64[(byte)InBuffer[lVar4 * 4 + 1]];
        *OutBuffer = bVar2 >> 4 | iT64[(byte)InBuffer[lVar4 * 4]] << 2;
        if (pbVar1 <= OutBuffer + 1) {
          return uVar7;
        }
        bVar3 = iT64[(byte)InBuffer[lVar4 * 4 + 2]];
        OutBuffer[1] = bVar3 >> 2 | bVar2 << 4;
        if (pbVar1 <= OutBuffer + 2) {
          return uVar7;
        }
        OutBuffer[2] = bVar3 << 6 | iT64[(byte)InBuffer[lVar4 * 4 + 3]];
        lVar4 = lVar4 + 1;
        OutBuffer = OutBuffer + 3;
      } while (iVar8 != (int)lVar4);
    }
  }
  else {
    sVar6 = 0;
  }
  return sVar6;
}

Assistant:

size_t                              /* Number of output bytes */
	Base64ToByteStream (
		      const char * InBuffer,           /* BASE64 encoded buffer */
		      size_t    InCount,          /* Number of input bytes */
		      uint8_t  * OutBuffer,	/* output buffer length */
		  size_t len         	/* length of output buffer */
	)
	{
		unsigned char * ps;
		unsigned char * pd;
		unsigned char   acc_1;
		unsigned char   acc_2;
		int             i;
		int             n;
		int             m;
		size_t outCount;

		if (isFirstTime) iT64Build();
		n = InCount/4;
		m = InCount%4;
		if (InCount && !m)
		     outCount = 3*n;
		else {
		     outCount = 0;
		     return 0;
		}

		ps = (unsigned char *)(InBuffer + InCount - 1);
		while ( *ps-- == P64 ) outCount--;
		ps = (unsigned char *)InBuffer;

		if (outCount > len) return -1;
		pd = OutBuffer;
		uint8_t * endOfOutBuffer = OutBuffer + outCount;
		for ( i = 0; i < n; i++ ){
		     acc_1 = iT64[*ps++];
		     acc_2 = iT64[*ps++];
		     acc_1 <<= 2;
		     acc_1 |= acc_2>>4;
		     *pd++  = acc_1;
			 if (pd >= endOfOutBuffer) break;

		     acc_2 <<= 4;
		     acc_1 = iT64[*ps++];
		     acc_2 |= acc_1 >> 2;
		     *pd++ = acc_2;
			  if (pd >= endOfOutBuffer) break;

		     acc_2 = iT64[*ps++];
		     acc_2 |= acc_1 << 6;
		     *pd++ = acc_2;
		}

		return outCount;
	}